

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O0

Address * __thiscall
ot::commissioner::UdpSocket::GetPeerAddr(Address *__return_storage_ptr__,UdpSocket *this)

{
  bool bVar1;
  int iVar2;
  ErrorCode local_d8 [4];
  Error local_c8;
  undefined1 local_9d;
  socklen_t local_9c;
  undefined1 local_98 [4];
  socklen_t len;
  sockaddr_storage addr;
  UdpSocket *this_local;
  Address *ret;
  
  local_9c = 0x80;
  local_9d = 0;
  addr.__ss_align = (unsigned_long)this;
  Address::Address(__return_storage_ptr__);
  if (((this->super_Socket).mIsConnected & 1U) == 0) {
    abort();
  }
  iVar2 = getpeername(*(int *)&(this->super_Socket).field_0xb4,(sockaddr *)local_98,&local_9c);
  if (iVar2 == 0) {
    Address::Set(&local_c8,__return_storage_ptr__,(sockaddr_storage *)local_98);
    local_d8[0] = kNone;
    bVar1 = commissioner::operator==(&local_c8,local_d8);
    Error::~Error(&local_c8);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      abort();
    }
    return __return_storage_ptr__;
  }
  abort();
}

Assistant:

Address UdpSocket::GetPeerAddr() const
{
    sockaddr_storage addr;
    socklen_t        len = sizeof(sockaddr_storage);
    Address          ret;

    VerifyOrDie(mIsConnected);
    VerifyOrDie(getpeername(mNetCtx.fd, reinterpret_cast<sockaddr *>(&addr), &len) == 0);
    SuccessOrDie(ret.Set(addr));
    return ret;
}